

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_tree_clusterizer.h
# Opt level: O3

void __thiscall
crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::generate_codebook
          (tree_clusterizer<crnlib::vec<2U,_float>_> *this,vec<2U,_float> *vectors,uint *weights,
          uint size,uint max_splits,bool generate_node_index_map,task_pool *pTask_pool)

{
  vector_vec_type *pvVar1;
  uint *puVar2;
  undefined8 uVar3;
  vec<2U,_float> *p;
  long lVar4;
  void *pvVar5;
  bool bVar6;
  uint uVar7;
  vq_node *pvVar8;
  ulong uVar9;
  pointer pNVar10;
  executable_task *pObj;
  vq_node *pvVar11;
  ulong uVar12;
  undefined7 in_register_00000089;
  int iVar13;
  uint uVar14;
  bool bVar15;
  float fVar16;
  float fVar17;
  double dVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  vector<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::split_alternative_node_task_params>
  params;
  priority_queue<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
  node_queue;
  priority_queue<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
  alternative_node_queue;
  uint local_b0;
  uint local_ac;
  elemental_vector local_a8;
  uint local_94;
  node_vec_type *local_90;
  undefined4 local_84;
  ulong local_80;
  priority_queue<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
  local_78;
  undefined1 local_58 [8];
  pointer local_50;
  elemental_vector *local_38;
  
  local_84 = (undefined4)CONCAT71(in_register_00000089,generate_node_index_map);
  this->m_vectors = vectors;
  uVar7 = (this->m_vectorsInfo).m_size;
  if (uVar7 != size) {
    if ((uVar7 <= size) && ((this->m_vectorsInfo).m_capacity < size)) {
      elemental_vector::increase_capacity
                ((elemental_vector *)&this->m_vectorsInfo,size,uVar7 + 1 == size,8,(object_mover)0x0
                 ,false);
    }
    (this->m_vectorsInfo).m_size = size;
  }
  uVar7 = (this->m_weightedVectors).m_size;
  if (uVar7 != size) {
    if ((uVar7 <= size) && ((this->m_weightedVectors).m_capacity < size)) {
      elemental_vector::increase_capacity
                ((elemental_vector *)&this->m_weightedVectors,size,uVar7 + 1 == size,8,
                 (object_mover)0x0,false);
    }
    (this->m_weightedVectors).m_size = size;
  }
  uVar7 = (this->m_weightedDotProducts).m_size;
  if (uVar7 != size) {
    if (uVar7 <= size) {
      if ((this->m_weightedDotProducts).m_capacity < size) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)&this->m_weightedDotProducts,size,uVar7 + 1 == size,8,
                   (object_mover)0x0,false);
        uVar7 = (this->m_weightedDotProducts).m_size;
      }
      memset((this->m_weightedDotProducts).m_p + uVar7,0,(ulong)(size - uVar7) << 3);
    }
    (this->m_weightedDotProducts).m_size = size;
  }
  uVar7 = (this->m_vectorsInfoLeft).m_size;
  if (uVar7 != size) {
    if ((uVar7 <= size) && ((this->m_vectorsInfoLeft).m_capacity < size)) {
      elemental_vector::increase_capacity
                ((elemental_vector *)&this->m_vectorsInfoLeft,size,uVar7 + 1 == size,8,
                 (object_mover)0x0,false);
    }
    (this->m_vectorsInfoLeft).m_size = size;
  }
  uVar7 = (this->m_vectorsInfoRight).m_size;
  if (uVar7 != size) {
    if ((uVar7 <= size) && ((this->m_vectorsInfoRight).m_capacity < size)) {
      elemental_vector::increase_capacity
                ((elemental_vector *)&this->m_vectorsInfoRight,size,uVar7 + 1 == size,8,
                 (object_mover)0x0,false);
    }
    (this->m_vectorsInfoRight).m_size = size;
  }
  uVar7 = (this->m_vectorComparison).m_size;
  if (uVar7 != size) {
    if (uVar7 <= size) {
      if ((this->m_vectorComparison).m_capacity < size) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)&this->m_vectorComparison,size,uVar7 + 1 == size,1,
                   (object_mover)0x0,false);
        uVar7 = (this->m_vectorComparison).m_size;
      }
      memset((this->m_vectorComparison).m_p + uVar7,0,(ulong)(size - uVar7));
    }
    (this->m_vectorComparison).m_size = size;
  }
  local_90 = &this->m_nodes;
  uVar14 = max_splits * 4;
  uVar7 = (this->m_nodes).m_size;
  if (uVar7 != uVar14) {
    if (uVar7 <= uVar14) {
      if ((this->m_nodes).m_capacity < uVar14) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)local_90,uVar14,uVar7 + 1 == uVar14,0x30,
                   vector<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::vq_node>::object_mover,
                   false);
        uVar7 = (this->m_nodes).m_size;
      }
      if (uVar14 - uVar7 != 0) {
        pvVar8 = local_90->m_p + uVar7;
        pvVar11 = pvVar8 + (uVar14 - uVar7);
        do {
          *(undefined8 *)(pvVar8->m_centroid).m_s = 0;
          pvVar8->m_total_weight = 0;
          pvVar8->m_left = -1;
          pvVar8->m_right = -1;
          pvVar8->m_codebook_index = -1;
          pvVar8->m_unsplittable = false;
          pvVar8->m_alternative = false;
          pvVar8->m_processed = false;
          pvVar8 = pvVar8 + 1;
        } while (pvVar8 != pvVar11);
      }
    }
    (this->m_nodes).m_size = uVar14;
  }
  pvVar1 = &this->m_codebook;
  p = (this->m_codebook).m_p;
  if (p != (vec<2U,_float> *)0x0) {
    crnlib_free(p);
    pvVar1->m_p = (vec<2U,_float> *)0x0;
    (this->m_codebook).m_size = 0;
    (this->m_codebook).m_capacity = 0;
  }
  if (pTask_pool == (task_pool *)0x0) {
    local_ac = 1;
  }
  else {
    local_ac = pTask_pool->m_num_threads + 1;
  }
  if ((this->m_vectorsInfo).m_size == 0) {
    fVar16 = 0.0;
    fVar17 = 0.0;
    dVar18 = 0.0;
    uVar9 = 0;
  }
  else {
    fVar16 = 0.0;
    fVar17 = 0.0;
    dVar18 = 0.0;
    uVar12 = 0;
    uVar9 = 0;
    do {
      (this->m_vectorsInfo).m_p[uVar12].index = (uint)uVar12;
      uVar7 = weights[uVar12];
      (this->m_vectorsInfo).m_p[uVar12].weight = uVar7;
      fVar19 = (float)uVar7;
      *(ulong *)(this->m_weightedVectors).m_p[uVar12].m_s =
           CONCAT44(fVar19 * (float)((ulong)*(undefined8 *)vectors[uVar12].m_s >> 0x20),
                    fVar19 * (float)*(undefined8 *)vectors[uVar12].m_s);
      uVar3 = *(undefined8 *)(this->m_weightedVectors).m_p[uVar12].m_s;
      fVar16 = fVar16 + (float)uVar3;
      fVar17 = fVar17 + (float)((ulong)uVar3 >> 0x20);
      fVar20 = (float)*(undefined8 *)vectors[uVar12].m_s;
      fVar21 = (float)((ulong)*(undefined8 *)vectors[uVar12].m_s >> 0x20);
      (this->m_weightedDotProducts).m_p[uVar12] =
           (double)((fVar21 * fVar21 + fVar20 * fVar20) * fVar19);
      dVar18 = dVar18 + (this->m_weightedDotProducts).m_p[uVar12];
      uVar9 = uVar9 + uVar7;
      uVar12 = uVar12 + 1;
    } while (uVar12 < (this->m_vectorsInfo).m_size);
  }
  local_58._4_4_ =
       (undefined4)(dVar18 - (double)((fVar17 * fVar17 + fVar16 * fVar16) / (float)uVar9));
  fVar19 = 1.0 / (float)uVar9;
  local_78.c.
  super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.c.
  super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.c.
  super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b0 = 0;
  pvVar8 = local_90->m_p;
  *(ulong *)(pvVar8->m_centroid).m_s = CONCAT44(fVar17 * fVar19,fVar16 * fVar19);
  pvVar8->m_total_weight = uVar9;
  pvVar8->m_variance = (float)local_58._4_4_;
  pvVar8->m_begin = 0;
  pvVar8->m_end = size;
  pvVar8->m_left = -1;
  pvVar8->m_right = -1;
  pvVar8->m_codebook_index = -1;
  pvVar8->m_unsplittable = false;
  pvVar8->m_alternative = false;
  pvVar8->m_processed = false;
  local_58._0_4_ = 0;
  std::
  priority_queue<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
  ::push(&local_78,(value_type *)local_58);
  local_b0 = local_b0 + 1;
  uVar14 = 1;
  uVar7 = uVar14;
  local_38 = (elemental_vector *)pvVar1;
  if (1 < local_ac) {
    uVar9 = (ulong)local_ac;
    if (1 < max_splits) {
      do {
        uVar7 = uVar14;
        if (((long)local_78.c.
                   super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_78.c.
                   super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3 == uVar9) ||
           (bVar6 = split_node(this,&local_78,&local_b0,pTask_pool), !bVar6)) break;
        uVar14 = uVar14 + 1;
        uVar7 = max_splits;
      } while (max_splits != uVar14);
    }
    if ((long)local_78.c.
              super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_78.c.
              super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
              ._M_impl.super__Vector_impl_data._M_start >> 3 == uVar9) {
      std::
      vector<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
      ::vector((vector<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
                *)local_58,&local_78.c);
      uVar14 = local_ac;
      local_94 = max_splits / local_ac;
      local_a8.m_p = (void *)0x0;
      local_a8.m_size = 0;
      local_a8.m_capacity = 0;
      local_80 = (ulong)max_splits;
      elemental_vector::increase_capacity(&local_a8,local_ac,false,0xc,(object_mover)0x0,false);
      local_a8.m_size = uVar14;
      pNVar10 = (pointer)CONCAT44(local_58._4_4_,local_58._0_4_);
      if (pNVar10 != local_50) {
        iVar13 = (int)local_80 * 2;
        local_ac = local_94 * 2;
        uVar14 = 0;
        do {
          pvVar5 = local_a8.m_p;
          uVar9 = (ulong)uVar14;
          lVar4 = uVar9 * 0xc;
          *(uint *)((long)local_a8.m_p + lVar4) = pNVar10->m_index;
          *(int *)((long)local_a8.m_p + lVar4 + 4) = iVar13;
          *(uint *)((long)local_a8.m_p + lVar4 + 8) = local_94;
          pObj = (executable_task *)crnlib_malloc(0x28);
          pObj->_vptr_executable_task = (_func_int **)&PTR_execute_task_001db9d0;
          pObj[1]._vptr_executable_task = (_func_int **)this;
          pObj[2]._vptr_executable_task = (_func_int **)split_alternative_node_task;
          pObj[3]._vptr_executable_task = (_func_int **)0x0;
          *(undefined4 *)&pObj[4]._vptr_executable_task = 1;
          task_pool::queue_task(pTask_pool,pObj,uVar9,(void *)((long)pvVar5 + uVar9 * 0xc));
          std::
          priority_queue<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
          ::pop((priority_queue<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
                 *)local_58);
          iVar13 = iVar13 + local_ac;
          uVar14 = uVar14 + 1;
          pNVar10 = (pointer)CONCAT44(local_58._4_4_,local_58._0_4_);
        } while (pNVar10 != local_50);
      }
      task_pool::join(pTask_pool);
      max_splits = (uint)local_80;
      if (local_a8.m_p != (void *)0x0) {
        crnlib_free(local_a8.m_p);
      }
      if ((void *)CONCAT44(local_58._4_4_,local_58._0_4_) != (void *)0x0) {
        operator_delete((void *)CONCAT44(local_58._4_4_,local_58._0_4_));
      }
    }
  }
  if (uVar7 < max_splits) {
    iVar13 = ~uVar7 + max_splits;
    do {
      bVar6 = split_node(this,&local_78,&local_b0,pTask_pool);
      bVar15 = iVar13 != 0;
      iVar13 = iVar13 + -1;
    } while (bVar6 && bVar15);
  }
  if (local_b0 != 0) {
    uVar9 = 0;
    do {
      pvVar8 = local_90->m_p;
      if ((pvVar8[uVar9].m_alternative != false) || (pvVar8[uVar9].m_left == -1)) {
        pvVar8 = pvVar8 + uVar9;
        uVar7 = (this->m_codebook).m_size;
        pvVar8->m_codebook_index = uVar7;
        if ((this->m_codebook).m_capacity <= uVar7) {
          elemental_vector::increase_capacity(local_38,uVar7 + 1,true,8,(object_mover)0x0,false);
          uVar7 = (this->m_codebook).m_size;
        }
        *(undefined8 *)(this->m_codebook).m_p[uVar7].m_s = *(undefined8 *)(pvVar8->m_centroid).m_s;
        puVar2 = &(this->m_codebook).m_size;
        *puVar2 = *puVar2 + 1;
        if (((char)local_84 != '\0') &&
           (uVar12 = (ulong)pvVar8->m_begin, pvVar8->m_begin < pvVar8->m_end)) {
          do {
            local_a8.m_p = *(void **)this->m_vectors[(this->m_vectorsInfo).m_p[uVar12].index].m_s;
            local_a8.m_size = pvVar8->m_codebook_index;
            hash_map<crnlib::vec<2U,_float>,_unsigned_int,_crnlib::hasher<crnlib::vec<2U,_float>_>,_crnlib::equal_to<crnlib::vec<2U,_float>_>_>
            ::insert((insert_result *)local_58,&this->m_node_index_map,(vec<2U,_float> *)&local_a8,
                     &local_a8.m_size);
            uVar12 = uVar12 + 1;
          } while (uVar12 < pvVar8->m_end);
        }
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 < local_b0);
  }
  if (local_78.c.
      super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.c.
                    super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void generate_codebook(VectorType* vectors, uint* weights, uint size, uint max_splits, bool generate_node_index_map = false, task_pool* pTask_pool = 0) {
    m_vectors = vectors;
    m_vectorsInfo.resize(size);
    m_weightedVectors.resize(size);
    m_weightedDotProducts.resize(size);
    m_vectorsInfoLeft.resize(size);
    m_vectorsInfoRight.resize(size);
    m_vectorComparison.resize(size);
    m_nodes.resize(max_splits << 2);
    m_codebook.clear();
    uint num_tasks = pTask_pool ? pTask_pool->get_num_threads() + 1 : 1;

    vq_node root;
    root.m_begin = 0;
    root.m_end = size;
    double ttsum = 0.0f;
    for (uint i = 0; i < m_vectorsInfo.size(); i++) {
      const VectorType& v = vectors[i];
      m_vectorsInfo[i].index = i;
      const uint weight = m_vectorsInfo[i].weight = weights[i];
      m_weightedVectors[i] = v * (float)weight;
      root.m_centroid += m_weightedVectors[i];
      root.m_total_weight += weight;
      m_weightedDotProducts[i] = v.dot(v) * weight;
      ttsum += m_weightedDotProducts[i];
    }
    root.m_variance = (float)(ttsum - (root.m_centroid.dot(root.m_centroid) / root.m_total_weight));
    root.m_centroid *= (1.0f / root.m_total_weight);

    std::priority_queue<NodeInfo> node_queue;
    uint begin_node = 0, end_node = begin_node, splits = 0;
    m_nodes[end_node] = root;
    node_queue.push(NodeInfo(end_node, root.m_variance));
    end_node++;
    splits++;

    if (num_tasks > 1) {
      while (splits < max_splits && node_queue.size() != num_tasks && split_node(node_queue, end_node, pTask_pool))
        splits++;
      if (node_queue.size() == num_tasks) {
        std::priority_queue<NodeInfo> alternative_node_queue = node_queue;
        uint alternative_node = max_splits << 1, alternative_max_splits = max_splits / num_tasks;
        crnlib::vector<split_alternative_node_task_params> params(num_tasks);
        for (uint task = 0; !alternative_node_queue.empty(); alternative_node_queue.pop(), alternative_node += alternative_max_splits << 1, task++) {
          params[task].main_node = alternative_node_queue.top().m_index;
          params[task].alternative_node = alternative_node;
          params[task].max_splits = alternative_max_splits;
          pTask_pool->queue_object_task(this, &tree_clusterizer::split_alternative_node_task, task, &params[task]);
        }
        pTask_pool->join();
      }
    }

    while (splits < max_splits && split_node(node_queue, end_node, pTask_pool))
      splits++;

    for (uint i = begin_node; i < end_node; i++) {
      vq_node& node = m_nodes[i];
      if (!node.m_alternative && node.m_left != -1)
        continue;
      node.m_codebook_index = m_codebook.size();
      m_codebook.push_back(node.m_centroid);
      if (generate_node_index_map) {
        for (uint j = node.m_begin; j < node.m_end; j++)
          m_node_index_map.insert(std::make_pair(m_vectors[m_vectorsInfo[j].index], node.m_codebook_index));
      }
    }
  }